

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkCollectCiNames(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pVVar5->pArray[lVar8]);
      pcVar6 = Extra_UtilStrsav(pcVar6);
      uVar1 = pVVar3->nSize;
      uVar2 = pVVar3->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar2 * 2;
          if (iVar7 <= (int)uVar2) goto LAB_002499b6;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = iVar7;
      }
LAB_002499b6:
      pVVar3->nSize = uVar1 + 1;
      pVVar3->pArray[(int)uVar1] = pcVar6;
      lVar8 = lVar8 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar8 < pVVar5->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectCiNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_Ptr_t * vNames;
    vNames = Vec_PtrAlloc( 100 );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_PtrPush( vNames, Extra_UtilStrsav(Abc_ObjName(pObj)) );
    return vNames;
}